

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_EveryoneWrites_Async.cpp
# Opt level: O0

int adios2::core::engine::BP5Writer::AsyncWriteThread_EveryoneWrites(AsyncWriteInfo *info)

{
  long in_RDI;
  uint64_t t;
  uint64_t mysize;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  unsigned_long *in_stack_00000088;
  TokenChain<unsigned_long> *in_stack_00000090;
  bool in_stack_000000af;
  size_t in_stack_000000b0;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_000000b8;
  AsyncWriteInfo *in_stack_000000c0;
  TokenChain<unsigned_long> *in_stack_ffffffffffffffc0;
  
  if ((*(long *)(in_RDI + 0x28) != 0) && (0 < *(int *)(in_RDI + 0x18))) {
    shm::TokenChain<unsigned_long>::RecvToken(in_stack_ffffffffffffffc0);
  }
  (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
  adios2::format::BufferV::Size(*(BufferV **)(in_RDI + 0x38));
  AsyncWriteOwnData(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000af);
  if (*(long *)(in_RDI + 0x28) != 0) {
    in_stack_ffffffffffffffc0 = (TokenChain<unsigned_long> *)0x1;
    shm::TokenChain<unsigned_long>::SendToken(in_stack_00000090,in_stack_00000088);
    if (*(int *)(in_RDI + 0x18) == 0) {
      shm::TokenChain<unsigned_long>::RecvToken(in_stack_ffffffffffffffc0);
    }
  }
  if (*(long **)(in_RDI + 0x38) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x38) + 8))();
  }
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)
             in_stack_ffffffffffffffc0);
  return 1;
}

Assistant:

int BP5Writer::AsyncWriteThread_EveryoneWrites(AsyncWriteInfo *info)
{
    if (info->tokenChain)
    {
        if (info->rank_chain > 0)
        {
            info->tokenChain->RecvToken();
        }
    }

    std::vector<core::iovec> DataVec = info->Data->DataVec();
    const uint64_t mysize = info->Data->Size();
    AsyncWriteOwnData(info, DataVec, mysize, true);

    if (info->tokenChain)
    {
        uint64_t t = 1;
        info->tokenChain->SendToken(t);
        if (!info->rank_chain)
        {
            info->tokenChain->RecvToken();
        }
    }
    delete info->Data;
    return 1;
}